

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadHandler.cxx
# Opt level: O0

int __thiscall cmCTestUploadHandler::ProcessHandler(cmCTestUploadHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  char *pcVar3;
  reference value;
  ostream *poVar4;
  string local_8a0;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  string local_830 [32];
  undefined1 local_810 [8];
  ostringstream cmCTestLog_msg_1;
  string *file;
  iterator __end1;
  iterator __begin1;
  SetOfStrings *__range1;
  string local_670;
  allocator<char> local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  allocator<char> local_539;
  string local_538;
  undefined1 local_518 [8];
  cmXMLWriter xml;
  string local_4b8;
  string local_498;
  undefined1 local_478 [8];
  string buildname;
  string local_450 [32];
  undefined1 local_430 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_2b1;
  string local_2b0;
  string local_280;
  undefined1 local_260 [8];
  cmGeneratedFileStream ofs;
  cmCTestUploadHandler *this_local;
  
  ofs._576_8_ = this;
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_260,None);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  cmCTest::GetCurrentTag_abi_cxx11_(&local_280,pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Upload.xml",&local_2b1);
  bVar2 = cmCTest::OpenOutputFile
                    (pcVar1,&local_280,&local_2b0,(cmGeneratedFileStream *)local_260,false);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_280);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"BuildName",(allocator<char> *)&xml.field_0x57);
    cmCTest::GetCTestConfiguration(&local_498,pcVar1,&local_4b8);
    cmCTest::SafeBuildIdField((string *)local_478,&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x57);
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_518,(ostream *)local_260,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_518,"UTF-8");
    cmXMLWriter::ProcessingInstruction
              ((cmXMLWriter *)local_518,"xml-stylesheet",
               "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"Site",&local_539);
    cmXMLWriter::StartElement((cmXMLWriter *)local_518,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator(&local_539);
    cmXMLWriter::Attribute<std::__cxx11::string>
              ((cmXMLWriter *)local_518,"BuildName",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478);
    cmCTest::GetCurrentTag_abi_cxx11_(&local_5a0,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_580,&local_5a0,"-");
    cmCTest::GetTestModelString_abi_cxx11_(&local_5c0,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_560,&local_580,&local_5c0);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_518,"BuildStamp",&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"Site",&local_601);
    cmCTest::GetCTestConfiguration(&local_5e0,pcVar1,&local_600);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_518,"Name",&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"ctest",&local_649);
    pcVar3 = cmVersion::GetCMakeVersion();
    std::operator+(&local_628,&local_648,pcVar3);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_518,"Generator",&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    cmCTest::AddSiteProperties((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_518);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"Upload",(allocator<char> *)((long)&__range1 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_518,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    __end1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->Files);
    file = (string *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Files);
    while( true ) {
      bVar2 = std::operator!=(&__end1,(_Self *)&file);
      if (!bVar2) break;
      value = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&__end1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_810);
      poVar4 = std::operator<<((ostream *)local_810,"\tUpload file: ");
      poVar4 = std::operator<<(poVar4,(string *)value);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                   ,0x3b,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_830);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_810);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"File",&local_851);
      cmXMLWriter::StartElement((cmXMLWriter *)local_518,&local_850);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_518,"filename",value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"Content",&local_879);
      cmXMLWriter::StartElement((cmXMLWriter *)local_518,&local_878);
      std::__cxx11::string::~string((string *)&local_878);
      std::allocator<char>::~allocator(&local_879);
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_518,"encoding",(char (*) [7])"base64");
      cmCTest::Base64EncodeFile(&local_8a0,(this->super_cmCTestGenericHandler).CTest,value);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_518,&local_8a0);
      std::__cxx11::string::~string((string *)&local_8a0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_518);
      cmXMLWriter::EndElement((cmXMLWriter *)local_518);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_518);
    cmXMLWriter::EndElement((cmXMLWriter *)local_518);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_518);
    this_local._4_4_ = 0;
    buildname.field_2._12_4_ = 1;
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_518);
    std::__cxx11::string::~string((string *)local_478);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_430);
    poVar4 = std::operator<<((ostream *)local_430,"Cannot open Upload.xml file");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                 ,0x22,pcVar3,false);
    std::__cxx11::string::~string(local_450);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_430);
    this_local._4_4_ = -1;
    buildname.field_2._12_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_260);
  return this_local._4_4_;
}

Assistant:

int cmCTestUploadHandler::ProcessHandler()
{
  cmGeneratedFileStream ofs;
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), "Upload.xml",
                                   ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open Upload.xml file" << std::endl);
    return -1;
  }
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp",
                this->CTest->GetCurrentTag() + "-" +
                  this->CTest->GetTestModelString());
  xml.Attribute("Name", this->CTest->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest") + cmVersion::GetCMakeVersion());
  this->CTest->AddSiteProperties(xml);
  xml.StartElement("Upload");

  for (std::string const& file : this->Files) {
    cmCTestOptionalLog(this->CTest, OUTPUT,
                       "\tUpload file: " << file << std::endl, this->Quiet);
    xml.StartElement("File");
    xml.Attribute("filename", file);
    xml.StartElement("Content");
    xml.Attribute("encoding", "base64");
    xml.Content(this->CTest->Base64EncodeFile(file));
    xml.EndElement(); // Content
    xml.EndElement(); // File
  }
  xml.EndElement(); // Upload
  xml.EndElement(); // Site
  xml.EndDocument();
  return 0;
}